

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioScope.cpp
# Opt level: O3

void __thiscall AudioScope::paintEvent(AudioScope *this,QPaintEvent *evt)

{
  Guarded<VisualizerBuffer> *this_00;
  size_t sVar1;
  int iVar2;
  QMutex *pQVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  QPainter painter;
  float right;
  float left;
  undefined1 auStack_a8 [12];
  float local_9c;
  QMutex *local_98;
  float local_90;
  float local_8c;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  QFrame::paintEvent((QPaintEvent *)this);
  this_00 = this->mBuffer;
  if (this_00 == (Guarded<VisualizerBuffer> *)0x0) {
    drawSilence(this);
    return;
  }
  pQVar3 = &this_00->mMutex;
  LOCK();
  bVar6 = (this_00->mMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
  if (bVar6) {
    (this_00->mMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
  }
  UNLOCK();
  if (!bVar6) {
    QBasicMutex::lockInternal();
  }
  sVar1 = VisualizerBuffer::size(&this_00->mHandle);
  if (sVar1 == 0) {
    drawSilence(this);
  }
  else {
    iVar2 = *(int *)(*(long *)&this->field_0x20 + 0x14);
    iVar4 = *(int *)(*(long *)&this->field_0x20 + 0x1c);
    local_98 = pQVar3;
    QPainter::QPainter((QPainter *)auStack_a8,(QPaintDevice *)&this->field_0x10);
    QPainter::setRenderHint((RenderHint)auStack_a8,true);
    QPainter::setPen((QColor *)auStack_a8);
    iVar4 = iVar4 - iVar2;
    local_90 = (float)(sVar1 & 0xffffffff) / (float)(iVar4 + -1);
    VisualizerBuffer::averageSample(&this_00->mHandle,0.0,local_90,(float *)&local_88,&local_9c);
    if (3 < iVar4 + 1) {
      local_8c = 0.0;
      iVar2 = 2;
      fVar7 = local_88._0_4_ * -32.0 + 33.0;
      fVar8 = local_9c * -32.0 + 97.0;
      uVar9 = 0;
      uVar10 = 0;
      do {
        local_8c = local_8c + local_90;
        local_48 = fVar7;
        fStack_44 = fVar8;
        uStack_40 = uVar9;
        uStack_3c = uVar10;
        VisualizerBuffer::averageSample
                  (&this_00->mHandle,local_8c,local_90,(float *)&local_88,&local_9c);
        local_58 = local_88._0_4_ * -32.0 + 33.0;
        fStack_54 = local_9c * -32.0 + 97.0;
        uStack_50 = 0;
        uStack_4c = 0;
        local_88 = (double)(iVar2 + -1);
        local_80 = (double)local_48;
        local_78 = (double)iVar2;
        local_70 = (double)local_58;
        iVar5 = (int)&local_88;
        local_68 = local_78;
        local_60 = local_88;
        QPainter::drawLines((QLineF *)auStack_a8,iVar5);
        local_80 = (double)fStack_44;
        local_70 = (double)fStack_54;
        local_88 = local_60;
        local_78 = local_68;
        QPainter::drawLines((QLineF *)auStack_a8,iVar5);
        iVar2 = iVar2 + 1;
        fVar7 = local_58;
        fVar8 = fStack_54;
        uVar9 = uStack_50;
        uVar10 = uStack_4c;
      } while (iVar4 != iVar2);
    }
    QPainter::~QPainter((QPainter *)auStack_a8);
    pQVar3 = local_98;
  }
  LOCK();
  bVar6 = (pQVar3->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x1;
  if (bVar6) {
    (pQVar3->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  }
  UNLOCK();
  if (!bVar6) {
    QBasicMutex::unlockInternal();
  }
  return;
}

Assistant:

void AudioScope::paintEvent(QPaintEvent *evt) {
    QFrame::paintEvent(evt);

    // it may be more efficient to do renderering in a separate thread
    // we can convert a sample buffer to a buffer of QLines, then
    // the paint event just draws the lines

    if (mBuffer == nullptr) {
        // no buffer, draw nothing
        drawSilence();
        return;
    }

    auto handle = mBuffer->access();
    auto size = handle->size();
    if (size == 0) {
        // buffer is empty, draw nothing
        drawSilence();
        return;
    }

    auto const w = width() - (TU::LINE_WIDTH * 2);
    
    QPainter painter(this);
    painter.setRenderHint(QPainter::Antialiasing);
    painter.setPen(mLineColor);

    // pixels per sample
    float ratio = (unsigned)size / (float)w;
    float index = 0;

    float prevLeft;
    float prevRight;
    sample(handle, 0.0f, ratio, prevLeft, prevRight);

    int const end = w + TU::LINE_WIDTH;
    for (int t = 1 + TU::LINE_WIDTH; t < end; ++t) {
        index += ratio;
        
        float leftSample;
        float rightSample;
        sample(handle, index, ratio, leftSample, rightSample);

        painter.drawLine(QLineF(t - 1, prevLeft, t, leftSample));
        painter.drawLine(QLineF(t - 1, prevRight, t, rightSample));

        prevLeft = leftSample;
        prevRight = rightSample;

        
    }
    
}